

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShape.cpp
# Opt level: O2

void __thiscall
chrono::ChVisualShape::SetTexture(ChVisualShape *this,string *filename,float scale_x,float scale_y)

{
  vector<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
  *this_00;
  pointer psVar1;
  element_type *peVar2;
  undefined1 local_48 [16];
  float local_38;
  float local_34;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  psVar1 = (this->material_list).
           super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->material_list;
  local_38 = scale_x;
  local_34 = scale_y;
  if (psVar1 == (this->material_list).
                super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    ChVisualMaterial::Default();
    std::make_shared<chrono::ChVisualMaterial,chrono::ChVisualMaterial&>
              ((ChVisualMaterial *)local_48);
    std::
    vector<std::shared_ptr<chrono::ChVisualMaterial>,std::allocator<std::shared_ptr<chrono::ChVisualMaterial>>>
    ::emplace_back<std::shared_ptr<chrono::ChVisualMaterial>>
              ((vector<std::shared_ptr<chrono::ChVisualMaterial>,std::allocator<std::shared_ptr<chrono::ChVisualMaterial>>>
                *)this_00,(shared_ptr<chrono::ChVisualMaterial> *)local_48);
  }
  else {
    ChVisualMaterial::Default();
    peVar2 = (psVar1->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    if (peVar2 != (element_type *)local_48._0_8_) goto LAB_00d7402d;
    ChVisualMaterial::Default();
    std::make_shared<chrono::ChVisualMaterial,chrono::ChVisualMaterial&>
              ((ChVisualMaterial *)local_48);
    std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((this_00->
                 super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
LAB_00d7402d:
  ChVisualMaterial::SetKdTexture
            ((((this_00->
               super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             filename,local_38,local_34);
  return;
}

Assistant:

void ChVisualShape::SetTexture(const std::string& filename, float scale_x, float scale_y) {
    // Ensure that material_list[0] is a new material
    if (material_list.empty())
        material_list.push_back(std::make_shared<ChVisualMaterial>(*ChVisualMaterial::Default()));
    else if (material_list[0] == ChVisualMaterial::Default())
        material_list[0] = std::make_shared<ChVisualMaterial>(*ChVisualMaterial::Default());

    material_list[0]->SetKdTexture(filename, scale_x, scale_y);
}